

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readTotalMultiplicity.hpp
# Opt level: O2

optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity> * __thiscall
njoy::ENDFtk::section::Type<12>::Multiplicities::
readTotalMultiplicity<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity> *__return_storage_ptr__,
          Multiplicities *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int size)

{
  TabulationRecord local_a0;
  
  if (MT == 1) {
    (__return_storage_ptr__->
    super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
    _M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>.
    super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_engaged =
         false;
  }
  else {
    TotalMultiplicity::TotalMultiplicity<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TotalMultiplicity *)&local_a0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    std::optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>::
    optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true>
              (__return_storage_ptr__,(TotalMultiplicity *)&local_a0);
    TabulationRecord::~TabulationRecord(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::optional< TotalMultiplicity >
readTotalMultiplicity( Iterator& begin,
                       const Iterator& end,
                       long& lineNumber,
                       int MAT,
                       int MF,
                       int MT,
                       int size ) {

  if ( size == 1 ) {

    return std::nullopt;
  }

  return std::make_optional( TotalMultiplicity( begin, end, lineNumber,
                                                MAT, MF, MT ) );
}